

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_agent.c
# Opt level: O0

int main(int argc,char **argv)

{
  LIBSSH2_CHANNEL *pLVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  libssh2_agent_publickey *local_78;
  libssh2_agent_publickey *prev_identity;
  libssh2_agent_publickey *identity;
  LIBSSH2_AGENT *agent;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  char *pcStack_48;
  int rc;
  char *userauthlist;
  char *fingerprint;
  int local_30;
  sockaddr_in sin;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  channel = (LIBSSH2_CHANNEL *)0x0;
  identity = (libssh2_agent_publickey *)0x0;
  local_78 = (libssh2_agent_publickey *)0x0;
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  session._4_4_ = libssh2_init(0);
  if (session._4_4_ != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)session._4_4_);
    return 1;
  }
  sin.sin_zero._4_4_ = socket(2,1,0);
  if (sin.sin_zero._4_4_ == -1) {
    fprintf(_stderr,"failed to create socket!\n");
    session._4_4_ = 1;
  }
  else {
    fingerprint._4_2_ = 2;
    fingerprint._6_2_ = htons(0x16);
    local_30 = i;
    iVar2 = connect(sin.sin_zero._4_4_,(sockaddr *)((long)&fingerprint + 4),0x10);
    if (iVar2 == 0) {
      channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session!\n");
      }
      else {
        session._4_4_ = libssh2_session_handshake(channel,sin.sin_zero._4_4_);
        if (session._4_4_ == 0) {
          userauthlist = (char *)libssh2_hostkey_hash(channel,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[0] = '\0';
          sin.sin_zero[1] = '\0';
          sin.sin_zero[2] = '\0';
          sin.sin_zero[3] = '\0';
          for (; (int)sin.sin_zero._0_4_ < 0x14; sin.sin_zero._0_4_ = sin.sin_zero._0_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)(byte)userauthlist[(int)sin.sin_zero._0_4_]);
          }
          fprintf(_stderr,"\n");
          pLVar1 = channel;
          pcVar4 = username;
          sVar3 = strlen(username);
          pcStack_48 = (char *)libssh2_userauth_list(pLVar1,pcVar4,sVar3 & 0xffffffff);
          if (pcStack_48 != (char *)0x0) {
            fprintf(_stderr,"Authentication methods: %s\n",pcStack_48);
            pcVar4 = strstr(pcStack_48,"publickey");
            if (pcVar4 == (char *)0x0) {
              fprintf(_stderr,"\"publickey\" authentication is not supported\n");
              goto LAB_0010185f;
            }
            identity = (libssh2_agent_publickey *)libssh2_agent_init(channel);
            if (identity == (libssh2_agent_publickey *)0x0) {
              fprintf(_stderr,"Failure initializing ssh-agent support\n");
              session._4_4_ = 1;
              goto LAB_0010185f;
            }
            iVar2 = libssh2_agent_connect(identity);
            if (iVar2 != 0) {
              fprintf(_stderr,"Failure connecting to ssh-agent\n");
              session._4_4_ = 1;
              goto LAB_0010185f;
            }
            iVar2 = libssh2_agent_list_identities(identity);
            if (iVar2 != 0) {
              fprintf(_stderr,"Failure requesting identities to ssh-agent\n");
              session._4_4_ = 1;
              goto LAB_0010185f;
            }
            while (session._4_4_ = libssh2_agent_get_identity(identity,&prev_identity,local_78),
                  session._4_4_ != 1) {
              if ((int)session._4_4_ < 0) {
                fprintf(_stderr,"Failure obtaining identity from ssh-agent support\n");
                session._4_4_ = 1;
                goto LAB_0010185f;
              }
              iVar2 = libssh2_agent_userauth(identity,username,prev_identity);
              if (iVar2 == 0) {
                fprintf(_stderr,"Authentication with username %s and public key %s succeeded.\n",
                        username,prev_identity->comment);
                break;
              }
              fprintf(_stderr,"Authentication with username %s and public key %s failed!\n",username
                      ,prev_identity->comment);
              local_78 = prev_identity;
            }
            if (session._4_4_ != 0) {
              fprintf(_stderr,"Could not continue authentication\n");
              goto LAB_0010185f;
            }
          }
          agent = (LIBSSH2_AGENT *)libssh2_channel_open_ex(channel,"session",7,0x200000,0x8000,0,0);
          if (agent == (LIBSSH2_AGENT *)0x0) {
            fprintf(_stderr,"Unable to open a session\n");
          }
          else {
            libssh2_channel_setenv_ex(agent,"FOO",3,"bar");
            iVar2 = libssh2_channel_request_pty_ex(agent,"vanilla",7,0,0,0x50,0x18,0,0);
            if (iVar2 == 0) {
              iVar2 = libssh2_channel_process_startup(agent,"shell",5,0,0);
              if (iVar2 != 0) {
                fprintf(_stderr,"Unable to request shell on allocated pty\n");
                goto LAB_0010185f;
              }
            }
            else {
              fprintf(_stderr,"Failed requesting pty\n");
            }
            if (agent != (LIBSSH2_AGENT *)0x0) {
              libssh2_channel_free(agent);
              agent = (LIBSSH2_AGENT *)0x0;
            }
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)session._4_4_);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect!\n");
    }
  }
LAB_0010185f:
  if (identity != (libssh2_agent_publickey *)0x0) {
    libssh2_agent_disconnect(identity);
    libssh2_agent_free(identity);
  }
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    libssh2_session_free(channel);
  }
  if (sin.sin_zero._4_4_ != -1) {
    shutdown(sin.sin_zero._4_4_,2);
    close(sin.sin_zero._4_4_);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return session._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_AGENT *agent = NULL;
    struct libssh2_agent_publickey *identity, *prev_identity = NULL;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        rc = 1;
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(!strstr(userauthlist, "publickey")) {
            fprintf(stderr, "\"publickey\" authentication is not supported\n");
            goto shutdown;
        }

        /* Connect to the ssh-agent */
        agent = libssh2_agent_init(session);
        if(!agent) {
            fprintf(stderr, "Failure initializing ssh-agent support\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_connect(agent)) {
            fprintf(stderr, "Failure connecting to ssh-agent\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_list_identities(agent)) {
            fprintf(stderr, "Failure requesting identities to ssh-agent\n");
            rc = 1;
            goto shutdown;
        }
        for(;;) {
            rc = libssh2_agent_get_identity(agent, &identity, prev_identity);
            if(rc == 1)
                break;
            if(rc < 0) {
                fprintf(stderr,
                        "Failure obtaining identity from ssh-agent support\n");
                rc = 1;
                goto shutdown;
            }
            if(libssh2_agent_userauth(agent, username, identity)) {
                fprintf(stderr, "Authentication with username %s and "
                        "public key %s failed!\n",
                        username, identity->comment);
            }
            else {
                fprintf(stderr, "Authentication with username %s and "
                        "public key %s succeeded.\n",
                        username, identity->comment);
                break;
            }
            prev_identity = identity;
        }
        if(rc) {
            fprintf(stderr, "Could not continue authentication\n");
            goto shutdown;
        }
    }

    /* We're authenticated now. */

    /* Request a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
        goto skip_shell;
    }

    /* Open a SHELL on that pty */
    if(libssh2_channel_shell(channel)) {
        fprintf(stderr, "Unable to request shell on allocated pty\n");
        goto shutdown;
    }

    /* At this point the shell can be interacted with using
     * libssh2_channel_read()
     * libssh2_channel_read_stderr()
     * libssh2_channel_write()
     * libssh2_channel_write_stderr()
     *
     * Blocking mode may be (en|dis)abled with: libssh2_channel_set_blocking()
     * If the server send EOF, libssh2_channel_eof() will return non-0
     * To send EOF to the server use: libssh2_channel_send_eof()
     * A channel can be closed with: libssh2_channel_close()
     * A channel can be freed with: libssh2_channel_free()
     */

skip_shell:

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

    /* Other channel types are supported via:
     * libssh2_scp_send()
     * libssh2_scp_recv2()
     * libssh2_channel_direct_tcpip()
     */

shutdown:

    if(agent) {
        libssh2_agent_disconnect(agent);
        libssh2_agent_free(agent);
    }

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return rc;
}